

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O2

int pub_decode_gost_ec(EVP_PKEY *pk,X509_PUBKEY *pub)

{
  int iVar1;
  int iVar2;
  EC_KEY *pEVar3;
  EC_GROUP *group;
  BIGNUM *a;
  BIGNUM *a_00;
  EC_POINT *pub_00;
  ASN1_OCTET_STRING *a_01;
  uchar *out;
  int pub_len;
  ASN1_OBJECT *palgobj;
  uchar *pubkey_buf;
  X509_ALGOR *palg;
  
  palg = (X509_ALGOR *)0x0;
  pubkey_buf = (uchar *)0x0;
  palgobj = (ASN1_OBJECT *)0x0;
  iVar1 = X509_PUBKEY_get0_param
                    ((ASN1_OBJECT **)&palgobj,&pubkey_buf,&pub_len,(X509_ALGOR **)&palg,
                     (X509_PUBKEY *)pub);
  if (iVar1 == 0) {
    a_01 = (ASN1_OCTET_STRING *)0x0;
  }
  else {
    iVar1 = OBJ_obj2nid((ASN1_OBJECT *)palgobj);
    a = (BIGNUM *)0x0;
    EVP_PKEY_assign((EVP_PKEY *)pk,iVar1,(void *)0x0);
    iVar1 = decode_gost_algor_params(pk,palg);
    a_00 = (BIGNUM *)0x0;
    a_01 = (ASN1_OCTET_STRING *)0x0;
    pub_00 = (EC_POINT *)0x0;
    out = (uchar *)0x0;
    iVar2 = 0;
    if (iVar1 == 0) goto LAB_001130db;
    pEVar3 = (EC_KEY *)EVP_PKEY_get0((EVP_PKEY *)pk);
    group = EC_KEY_get0_group(pEVar3);
    a_01 = d2i_ASN1_OCTET_STRING((ASN1_OCTET_STRING **)0x0,&pubkey_buf,(long)pub_len);
    if (a_01 == (ASN1_OCTET_STRING *)0x0) {
      ERR_GOST_error(0x86,0xc0100,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                     ,0x39f);
      iVar2 = 0;
      a = (BIGNUM *)0x0;
      a_00 = (BIGNUM *)0x0;
      a_01 = (ASN1_OCTET_STRING *)0x0;
      pub_00 = (EC_POINT *)0x0;
      out = (uchar *)0x0;
      goto LAB_001130db;
    }
    out = (uchar *)CRYPTO_malloc(a_01->length,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                                 ,0x3a2);
    if (out != (uchar *)0x0) {
      BUF_reverse(out,a_01->data,(long)a_01->length);
      iVar1 = a_01->length / 2;
      a_00 = BN_bin2bn(out,iVar1,(BIGNUM *)0x0);
      a = BN_bin2bn(out + iVar1,iVar1,(BIGNUM *)0x0);
      if ((a == (BIGNUM *)0x0) || (a_00 == (BIGNUM *)0x0)) {
        ERR_GOST_error(0x86,0x80003,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                       ,0x3ae);
        pub_00 = (EC_POINT *)0x0;
        iVar2 = 0;
      }
      else {
        pub_00 = EC_POINT_new(group);
        iVar2 = 0;
        iVar1 = EC_POINT_set_affine_coordinates(group,pub_00,a,a_00,0);
        if (iVar1 == 0) {
          ERR_GOST_error(0x86,0x80010,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                         ,0x3b3);
        }
        else {
          pEVar3 = (EC_KEY *)EVP_PKEY_get0((EVP_PKEY *)pk);
          iVar2 = EC_KEY_set_public_key(pEVar3,pub_00);
          if (iVar2 == 0) {
            ERR_GOST_error(0x86,0x80010,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                           ,0x3b9);
            iVar2 = 0;
          }
        }
      }
      goto LAB_001130db;
    }
    ERR_GOST_error(0x86,0xc0100,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                   ,0x3a4);
  }
  a = (BIGNUM *)0x0;
  a_00 = (BIGNUM *)0x0;
  pub_00 = (EC_POINT *)0x0;
  out = (uchar *)0x0;
  iVar2 = 0;
LAB_001130db:
  EC_POINT_free(pub_00);
  BN_free(a);
  BN_free(a_00);
  CRYPTO_free(out);
  ASN1_OCTET_STRING_free(a_01);
  return iVar2;
}

Assistant:

static int pub_decode_gost_ec(EVP_PKEY *pk, const X509_PUBKEY *pub)
{
    X509_ALGOR *palg = NULL;
    const unsigned char *pubkey_buf = NULL;
    unsigned char *databuf = NULL;
    ASN1_OBJECT *palgobj = NULL;
    int pub_len;
    EC_POINT *pub_key = NULL;
    BIGNUM *X = NULL, *Y = NULL;
    ASN1_OCTET_STRING *octet = NULL;
    size_t len;
    const EC_GROUP *group;
    int retval = 0;

    if (!X509_PUBKEY_get0_param(&palgobj, &pubkey_buf, &pub_len, &palg, pub))
        goto ret;
    EVP_PKEY_assign(pk, OBJ_obj2nid(palgobj), NULL);
    if (!decode_gost_algor_params(pk, palg))
        goto ret;
    group = EC_KEY_get0_group(EVP_PKEY_get0(pk));
    octet = d2i_ASN1_OCTET_STRING(NULL, &pubkey_buf, pub_len);
    if (!octet) {
        GOSTerr(GOST_F_PUB_DECODE_GOST_EC, ERR_R_MALLOC_FAILURE);
        goto ret;
    }
    databuf = OPENSSL_malloc(octet->length);
    if (!databuf) {
        GOSTerr(GOST_F_PUB_DECODE_GOST_EC, ERR_R_MALLOC_FAILURE);
        goto ret;
    }

    BUF_reverse(databuf, octet->data, octet->length);
    len = octet->length / 2;

    Y = BN_bin2bn(databuf, len, NULL);
    X = BN_bin2bn(databuf + len, len, NULL);
    if (!X || !Y) {
        GOSTerr(GOST_F_PUB_DECODE_GOST_EC, ERR_R_BN_LIB);
        goto ret;
    }
    pub_key = EC_POINT_new(group);
    if (!EC_POINT_set_affine_coordinates(group, pub_key, X, Y, NULL)) {
        GOSTerr(GOST_F_PUB_DECODE_GOST_EC, ERR_R_EC_LIB);
        goto ret;
    }

    retval = EC_KEY_set_public_key(EVP_PKEY_get0(pk), pub_key);
    if (!retval)
        GOSTerr(GOST_F_PUB_DECODE_GOST_EC, ERR_R_EC_LIB);

ret:
    EC_POINT_free(pub_key);
    BN_free(X);
    BN_free(Y);
    OPENSSL_free(databuf);
    ASN1_OCTET_STRING_free(octet);
    return retval;
}